

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O2

void Msat_IntVecPush(Msat_IntVec_t *p,int Entry)

{
  int iVar1;
  int nCapMin;
  
  iVar1 = p->nSize;
  if (iVar1 == p->nCap) {
    nCapMin = 0x10;
    if (0xf < iVar1) {
      nCapMin = iVar1 * 2;
    }
    Msat_IntVecGrow(p,nCapMin);
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Entry;
  return;
}

Assistant:

void Msat_IntVecPush( Msat_IntVec_t * p, int Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Msat_IntVecGrow( p, 16 );
        else
            Msat_IntVecGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}